

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O2

void uo_cb_destroy(uo_cb *cb)

{
  uo_cb_func_linklist *link;
  uo_linklist *puVar1;
  uo_linklist *puVar2;
  long *in_FS_OFFSET;
  
  uo_stack_destroy_at(&cb->stack);
  while (link = (uo_cb_func_linklist *)(cb->funclist).next,
        link != (uo_cb_func_linklist *)&cb->funclist) {
    puVar1 = (link->link).next;
    puVar2 = (link->link).prev;
    puVar1->prev = puVar2;
    puVar2->next = puVar1;
    (link->link).next = (uo_linklist *)0x0;
    (link->link).prev = (uo_linklist *)0x0;
    uo_cb_func_linkpool_return(link);
  }
  uo__linklist_link((uo_linklist *)(*in_FS_OFFSET + -0x40),&cb[-1].funclist);
  return;
}

Assistant:

void uo_cb_destroy(
    uo_cb *cb)
{
    uo_stack_destroy_at(&cb->stack);

    while (!uo_linklist_is_empty(&cb->funclist))
    {
        uo_cb_func_linklist *cb_func_linklist = (uo_cb_func_linklist *)uo_linklist_next(&cb->funclist);
        uo_linklist_unlink(cb_func_linklist);
        uo_cb_func_linkpool_return(cb_func_linklist);
    }

    uo_cb_linkpool_return(uo_cb_get_linklist(cb));
}